

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void dump_autoinscriptions(ang_file *f)

{
  object_kind *poVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  char name [120];
  
  lVar5 = 0;
  for (uVar4 = 0; poVar1 = k_info, uVar4 < z_info->k_max; uVar4 = uVar4 + 1) {
    if ((*(long *)(k_info->flags + lVar5 + -0x80) != 0) &&
       (*(int *)(k_info->flags + lVar5 + -0x5c) != 0)) {
      pcVar2 = get_autoinscription((object_kind *)(k_info->flags + lVar5 + -0x80),true);
      if (pcVar2 != (char *)0x0) {
        object_short_name(name,0x78,*(char **)(poVar1->flags + lVar5 + -0x80));
        pcVar3 = tval_find_name(*(wchar_t *)(poVar1->flags + lVar5 + -0x5c));
        file_putf(f,"inscribe:%s:%s:%s\n",pcVar3,name,pcVar2);
      }
    }
    lVar5 = lVar5 + 0x2a0;
  }
  return;
}

Assistant:

void dump_autoinscriptions(ang_file *f) {
	int i;
	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *k = &k_info[i];
		char name[120];
		const char *note;

		if (!k->name || !k->tval) continue;

		/* Only aware autoinscriptions go to the prefs file */
		note = get_autoinscription(k, true);
		if (note) {
			object_short_name(name, sizeof name, k->name);
			file_putf(f, "inscribe:%s:%s:%s\n", tval_find_name(k->tval), name, note);
		}
	}
}